

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<spirv_cross::Meta::Decoration,_0UL>::reserve
          (SmallVector<spirv_cross::Meta::Decoration,_0UL> *this,size_t count)

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 *puVar3;
  ulong uVar4;
  Decoration *pDVar5;
  ulong uVar6;
  Decoration *pDVar7;
  long lVar8;
  
  if (count < 0xa72f05397829cc) {
    uVar6 = this->buffer_capacity;
    if (uVar6 < count) {
      uVar6 = uVar6 + (uVar6 == 0);
      do {
        uVar4 = uVar6;
        uVar6 = uVar4 * 2;
      } while (uVar4 < count);
      pDVar5 = (Decoration *)malloc(uVar4 * 0x188);
      if (pDVar5 == (Decoration *)0x0) goto LAB_0023f95b;
      pDVar7 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
      if ((pDVar5 != pDVar7) &&
         ((this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size != 0)) {
        lVar8 = 0;
        uVar6 = 0;
        do {
          Meta::Decoration::Decoration
                    ((Decoration *)((long)&(pDVar5->alias)._M_dataplus._M_p + lVar8),
                     (Decoration *)
                     ((long)&(((this->super_VectorView<spirv_cross::Meta::Decoration>).ptr)->alias).
                             _M_dataplus._M_p + lVar8));
          pDVar7 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)(pDVar7->extended).values + lVar8 + -0x38));
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)&(pDVar7->decoration_flags).higher._M_h._M_buckets + lVar8));
          pcVar2 = *(char **)((long)&(pDVar7->user_type)._M_dataplus._M_p + lVar8);
          if ((pDVar7->user_type).field_2._M_local_buf + lVar8 != pcVar2) {
            operator_delete(pcVar2);
          }
          pcVar2 = *(char **)((long)&(pDVar7->hlsl_semantic)._M_dataplus._M_p + lVar8);
          if ((pDVar7->hlsl_semantic).field_2._M_local_buf + lVar8 != pcVar2) {
            operator_delete(pcVar2);
          }
          pcVar2 = *(char **)((long)&(pDVar7->qualified_alias)._M_dataplus._M_p + lVar8);
          if ((pDVar7->qualified_alias).field_2._M_local_buf + lVar8 != pcVar2) {
            operator_delete(pcVar2);
          }
          puVar1 = (undefined8 *)((long)&(pDVar7->alias)._M_dataplus._M_p + lVar8);
          puVar3 = (undefined8 *)*puVar1;
          if (puVar1 + 2 != puVar3) {
            operator_delete(puVar3);
          }
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x188;
        } while (uVar6 < (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size);
        pDVar7 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
      }
      if (pDVar7 != (Decoration *)0x0) {
        free(pDVar7);
      }
      (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr = pDVar5;
      this->buffer_capacity = uVar4;
    }
    return;
  }
LAB_0023f95b:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}